

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O1

void __thiscall ON_SubDHeap::ReturnEdge(ON_SubDHeap *this,ON_SubDEdge *e)

{
  if (e != (ON_SubDEdge *)0x0) {
    if (e->m_facex != (ON_SubDFacePtr *)0x0) {
      ReturnArray(this,(ulong)e->m_facex_capacity,&e->m_facex->m_ptr);
    }
    (e->super_ON_SubDComponentBase).m_archive_id = 0xffffffff;
    (e->super_ON_SubDComponentBase).m_status = ON_ComponentStatus::Deleted;
    e->m_next_edge = this->m_unused_edge;
    this->m_unused_edge = e;
  }
  return;
}

Assistant:

void ON_SubDHeap::ReturnEdge(class ON_SubDEdge* e)
{
  if (nullptr != e)
  {
    if (nullptr != e->m_facex)
      ReturnArray(e->m_facex_capacity,(ON__UINT_PTR*)e->m_facex);
    (&e->m_id)[1] = ON_UNSET_UINT_INDEX; // m_archive_id == ON_UNSET_UINT_INDEX marks the fixed size pool element as unused
    e->m_status = ON_ComponentStatus::Deleted;
    e->m_next_edge = m_unused_edge;
    m_unused_edge = e;
    // It is critical that e->m_symmetry_set_next remains set
    // so deleted elements of symmetric SubDs can be found.

    // NO! // m_fspe.ReturnElement(e);
    // See comments in AllocateVertexAndSetId();
  }
}